

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

void Abc_NtkInsertMfs(Abc_Ntk_t *pNtk,Sfm_Ntk_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Abc_Obj_t *pAVar5;
  bool bVar6;
  int iVar7;
  void *__s;
  Vec_Int_t *vCover;
  int *__ptr;
  Vec_Int_t *pVVar8;
  word *pTruth;
  char *pSop;
  ulong uVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  
  pVVar11 = pNtk->vObjs;
  iVar1 = pVVar11->nSize;
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  if ((iVar7 == 0) || (__s = malloc((long)iVar7 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)iVar1 * 4);
  }
  pVVar2 = pNtk->vCis;
  if (pVVar2->nSize < 1) {
    if (iVar1 < 1) {
      bVar6 = false;
      goto LAB_002e00c0;
    }
  }
  else {
    ppvVar3 = pVVar2->pArray;
    lVar10 = 0;
    do {
      iVar7 = *(int *)((long)ppvVar3[lVar10] + 0x40);
      if (((long)iVar7 < 0) || (iVar1 <= iVar7)) goto LAB_002e028c;
      *(undefined4 *)((long)__s + (long)iVar7 * 4) = *(undefined4 *)((long)ppvVar3[lVar10] + 0x10);
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar2->nSize);
  }
  ppvVar3 = pVVar11->pArray;
  uVar9 = 0;
  do {
    pvVar4 = ppvVar3[uVar9];
    if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
      iVar7 = *(int *)((long)pvVar4 + 0x40);
      if (0 < (long)iVar7) {
        if (iVar1 <= iVar7) {
LAB_002e028c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)((long)__s + (long)iVar7 * 4) = *(undefined4 *)((long)pvVar4 + 0x10);
      }
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 < (ulong)(long)iVar1);
  lVar10 = 0;
  do {
    pAVar5 = (Abc_Obj_t *)pVVar11->pArray[lVar10];
    if (((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) &&
       (iVar7 = Sfm_NodeReadFixed(p,(pAVar5->field_6).iTemp), iVar7 == 0)) {
      Abc_ObjRemoveFanins(pAVar5);
    }
    lVar10 = lVar10 + 1;
    pVVar11 = pNtk->vObjs;
  } while (lVar10 < pVVar11->nSize);
  bVar6 = 0 < pVVar11->nSize;
LAB_002e00c0:
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  __ptr = (int *)malloc(0x40000);
  vCover->pArray = __ptr;
  if (bVar6) {
    lVar10 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar11->pArray[lVar10];
      if (((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) &&
         (((pAVar5->field_6).iTemp != 0 &&
          (iVar7 = Sfm_NodeReadFixed(p,(pAVar5->field_6).iTemp), iVar7 == 0)))) {
        iVar7 = Sfm_NodeReadUsed(p,(pAVar5->field_6).iTemp);
        if (iVar7 == 0) {
          Abc_NtkDeleteObj(pAVar5);
        }
        else {
          pVVar8 = Sfm_NodeReadFanins(p,(pAVar5->field_6).iTemp);
          if (0 < pVVar8->nSize) {
            lVar12 = 0;
            do {
              iVar7 = pVVar8->pArray[lVar12];
              if (((long)iVar7 < 0) || (iVar1 <= iVar7)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar7 = *(int *)((long)__s + (long)iVar7 * 4);
              if (((long)iVar7 < 0) || (pNtk->vObjs->nSize <= iVar7)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              Abc_ObjAddFanin(pAVar5,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar7]);
              lVar12 = lVar12 + 1;
            } while (lVar12 < pVVar8->nSize);
          }
          pTruth = Sfm_NodeReadTruth(p,(pAVar5->field_6).iTemp);
          pSop = Abc_SopCreateFromTruthIsop
                           ((Mem_Flex_t *)pNtk->pManFunc,pVVar8->nSize,pTruth,vCover);
          (pAVar5->field_5).pData = pSop;
          iVar7 = Abc_SopGetVarNum(pSop);
          if (iVar7 != pVVar8->nSize) {
            __assert_fail("Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                          ,0x14b,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar10 < pVVar11->nSize);
    __ptr = vCover->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vCover);
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Abc_NtkInsertMfs( Abc_Ntk_t * pNtk, Sfm_Ntk_t * p )
{
    Vec_Int_t * vCover, * vMap, * vArray;
    Abc_Obj_t * pNode;
    word * pTruth;
    int i, k, Fanin;
    // map new IDs into old nodes
    vMap = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->iTemp > 0 )
            Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    // remove old fanins
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Sfm_NodeReadFixed(p, pNode->iTemp) )
            Abc_ObjRemoveFanins( pNode );
    // create new fanins
    vCover = Vec_IntAlloc( 1 << 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->iTemp == 0 || Sfm_NodeReadFixed(p, pNode->iTemp) )
            continue;
        if ( !Sfm_NodeReadUsed(p, pNode->iTemp) )
        {
            Abc_NtkDeleteObj( pNode );
            continue;
        }
        // update fanins
        vArray = Sfm_NodeReadFanins( p, pNode->iTemp );
        Vec_IntForEachEntry( vArray, Fanin, k )
            Abc_ObjAddFanin( pNode, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, Fanin)) );
        pTruth = Sfm_NodeReadTruth( p, pNode->iTemp );
        pNode->pData = Abc_SopCreateFromTruthIsop( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntSize(vArray), pTruth, vCover );
        assert( Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray) );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vMap );
}